

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O3

Type * __thiscall
spvtools::opt::ConvertToHalfPass::FloatVectorType
          (ConvertToHalfPass *this,uint32_t v_len,uint32_t width)

{
  IRContext *this_00;
  Type *pTVar1;
  Vector vec_ty;
  Vector local_48;
  
  pTVar1 = FloatScalarType(this,width);
  analysis::Vector::Vector(&local_48,pTVar1,v_len);
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(this_00);
  }
  pTVar1 = analysis::TypeManager::GetRegisteredType
                     ((this_00->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,&local_48.super_Type);
  local_48.super_Type._vptr_Type = (_func_int **)&PTR__Type_003d7f68;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_48.super_Type.decorations_);
  return pTVar1;
}

Assistant:

analysis::Type* ConvertToHalfPass::FloatVectorType(uint32_t v_len,
                                                   uint32_t width) {
  analysis::Type* reg_float_ty = FloatScalarType(width);
  analysis::Vector vec_ty(reg_float_ty, v_len);
  return context()->get_type_mgr()->GetRegisteredType(&vec_ty);
}